

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

int __thiscall
Analysis::LexicalAnalysis::PreTokenize
          (LexicalAnalysis *this,vector<char,_std::allocator<char>_> *Code,
          vector<int,_std::allocator<int>_> *Table)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int *piVar7;
  bool bVar8;
  bool bVar9;
  vector<int,_std::allocator<int>_> *__range1;
  char *pcVar10;
  long lVar11;
  long lVar12;
  string quote;
  string brackets;
  string symbols;
  string operators;
  int local_bc;
  vector<char,_std::allocator<char>_> *local_b8;
  long local_b0;
  long local_a8;
  long local_90;
  long local_88;
  long local_70;
  long local_68;
  long local_50;
  long local_48;
  
  local_b8 = Code;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"+-*/=",(allocator<char> *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"#\'$%&!/\\:.,;",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"(){}[]",(allocator<char> *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"\"",(allocator<char> *)&local_bc);
  for (pcVar10 = (local_b8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start; lVar4 = local_48, lVar12 = local_50,
      pcVar10 !=
      (local_b8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish; pcVar10 = pcVar10 + 1) {
    for (lVar11 = 0; lVar3 = local_a8, lVar2 = local_b0, lVar4 != lVar11; lVar11 = lVar11 + 1) {
      if (*pcVar10 == *(char *)(lVar12 + lVar11)) {
        local_bc = 1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(Table,&local_bc);
      }
    }
    for (lVar12 = 0; lVar11 = local_68, lVar4 = local_70, lVar3 != lVar12; lVar12 = lVar12 + 1) {
      if (*pcVar10 == *(char *)(lVar2 + lVar12)) {
        local_bc = 7;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(Table,&local_bc);
      }
    }
    for (lVar12 = 0; lVar3 = local_88, lVar2 = local_90, lVar11 != lVar12; lVar12 = lVar12 + 1) {
      if (*pcVar10 == *(char *)(lVar4 + lVar12)) {
        local_bc = 2;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(Table,&local_bc);
      }
    }
    for (lVar12 = 0; lVar3 != lVar12; lVar12 = lVar12 + 1) {
      if (*pcVar10 == *(char *)(lVar2 + lVar12)) {
        local_bc = 3;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(Table,&local_bc);
      }
    }
    cVar5 = *pcVar10;
    if (cVar5 == ' ') {
      local_bc = 6;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(Table,&local_bc);
      cVar5 = *pcVar10;
    }
    iVar6 = isalpha((int)cVar5);
    if (iVar6 == 0) {
      if ((int)cVar5 - 0x30U < 10) {
        local_bc = 5;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(Table,&local_bc);
      }
    }
    else {
      local_bc = 4;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(Table,&local_bc);
    }
  }
  piVar7 = (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  bVar8 = false;
  do {
    if (piVar7 == piVar1) {
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return 0;
    }
    if (*piVar7 == 7) {
      bVar9 = (bool)(bVar8 ^ 1);
LAB_00102bdb:
      *piVar7 = 10;
      bVar8 = bVar9;
    }
    else {
      bVar9 = true;
      if (bVar8) goto LAB_00102bdb;
      bVar8 = false;
    }
    piVar7 = piVar7 + 1;
  } while( true );
}

Assistant:

int LexicalAnalysis::PreTokenize(std::vector<char> &Code, std::vector<int> &Table) {

        std::string operators = "+-*/=";
        std::string symbols = "#'$%&!/\\:.,;";
        std::string brackets = "(){}[]";
        std::string quote = "\"";

        //check which type the char of the actual index is and
        //assign its type to the Table vector at a parallel index
        for (auto c = Code.cbegin(); c != Code.cend(); ++c) {
            for (auto o : operators) {
                if (*c == o) {
                    Table.push_back(op);
                }
            }
            for (auto q : quote) {
                if (*c == q) {
                    Table.push_back(quotes);
                }
            }
            for (auto s : symbols) {
                if (*c == s) {
                    Table.push_back(symbol);
                }
            }
            for (auto b : brackets) {
                if (*c == b) {
                    Table.push_back(bracket);
                }
            }

            if (*c == ' '){
                Table.push_back(empty);
            }
            if (std::isalpha(*c)) {
                Table.push_back(letter);
            } else if (std::isdigit(*c)) {
                Table.push_back(digit);
            }
        }

        int counter = 0;
        bool flag = false;
        for (int i : Table) {

            if (i == quotes) {
                flag = !flag;
                Table[counter] = 10;
            } else if (flag == true) {
                Table[counter] = 10;
            }
            counter++;
        }
        return 0;
    }